

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_common.hpp
# Opt level: O1

void __thiscall
oqpi::local_sync_object<oqpi::posix_semaphore>::local_sync_object<int&,int&>
          (local_sync_object<oqpi::posix_semaphore> *this,int *args,int *args_1)

{
  int32_t initCount;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  initCount = *args;
  (this->super_posix_semaphore).maxCount_ = *args_1;
  posix_semaphore_wrapper::posix_semaphore_wrapper
            (&(this->super_posix_semaphore).sem_,&local_48,open_or_create,initCount);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

local_sync_object(_Args &&...args)
            : _Impl("", sync_object_creation_options::open_or_create, std::forward<_Args>(args)...)
        {}